

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatted_exporters.cpp
# Opt level: O0

void traverse_ext_json(string *curr_json,size_t curr_node,ExtIsoForest *model,
                      vector<IsoHPlane,_std::allocator<IsoHPlane>_> *nodes,
                      size_t *terminal_node_mappings,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *numeric_colnames,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *categ_colnames,
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *categ_levels,bool output_tree_num,bool index1,size_t tree_num)

{
  ulong uVar1;
  const_reference pvVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  runtime_error *this;
  byte bVar12;
  ExtIsoForest *in_RCX;
  size_t in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  undefined7 in_stack_00000021;
  size_t categ;
  size_t ix;
  size_t n_visited_categ;
  size_t n_visited_numeric;
  size_t terminal_idx;
  double score_write;
  IsoHPlane *hplane;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  int __val;
  double local_780;
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string local_690 [38];
  undefined1 local_66a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_669 [2];
  undefined1 local_621 [209];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  ulong local_470;
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  ulong local_268;
  size_type local_260;
  size_type local_258;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  pointer local_d0;
  double local_c8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [38];
  bool bVar14;
  bool bVar15;
  undefined6 in_stack_ffffffffffffffb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  
  bVar12 = in_stack_00000018 & 1;
  bVar5 = in_stack_00000020 & 1;
  if (!interrupt_switch) {
    register0x00000000 =
         std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                   ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_RSI);
    if (in_RSI != (string *)0x0) {
      std::__cxx11::string::append((char *)in_RDI);
    }
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff788);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                   in_stack_fffffffffffff750);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                   (char *)in_stack_fffffffffffff750);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    if (stack0xffffffffffffffb0->hplane_left == 0) {
      if ((*(int *)(in_RDX + 0x24) == 0x5c) || (*(int *)(in_RDX + 0x24) == 0x5f)) {
        local_780 = -stack0xffffffffffffffb0->score;
      }
      else {
        local_780 = stack0xffffffffffffffb0->score;
      }
      local_c8 = local_780;
      local_d0 = (&(in_R8->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                   super__Vector_impl_data._M_start)[(long)in_RSI];
      std::__cxx11::to_string((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758))
      ;
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     in_stack_fffffffffffff750);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     (char *)in_stack_fffffffffffff750);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff788);
      std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     (char *)in_stack_fffffffffffff750);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
    }
    else {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff788);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     in_stack_fffffffffffff750);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     (char *)in_stack_fffffffffffff750);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff788);
      std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     (char *)in_stack_fffffffffffff750);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_230);
      local_258 = 0;
      local_260 = 0;
      for (local_268 = 0; uVar1 = local_268,
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&stack0xffffffffffffffb0->col_num), uVar1 < sVar6;
          local_268 = local_268 + 1) {
        if (local_268 != 0) {
          std::__cxx11::string::append((char *)in_RDI);
        }
        std::__cxx11::string::append((char *)in_RDI);
        pvVar7 = std::vector<ColType,_std::allocator<ColType>_>::operator[]
                           (&stack0xffffffffffffffb0->col_type,local_268);
        if (*pvVar7 == Numeric) {
          pvVar16 = in_R9;
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&stack0xffffffffffffffb0->col_num,local_268);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_R9,*pvVar8);
          std::operator+(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                         (char *)in_stack_fffffffffffff750);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&stack0xffffffffffffffb0->coef,local_258);
          std::__cxx11::to_string
                    ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                         (char *)in_stack_fffffffffffff750);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&stack0xffffffffffffffb0->mean,local_258);
          std::__cxx11::to_string
                    ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_288);
          std::__cxx11::string::~string(local_348);
          std::__cxx11::string::~string(local_2a8);
          std::__cxx11::string::~string(local_2c8);
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::~string(local_2e8);
          std::__cxx11::string::~string(local_308);
          in_R9 = pvVar16;
          if (*(int *)(in_RDX + 0x20) != 0) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      (&stack0xffffffffffffffb0->fill_val,local_268);
            std::__cxx11::to_string
                      ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           in_stack_fffffffffffff750);
            std::__cxx11::string::append((string *)in_RDI);
            std::__cxx11::string::~string(local_368);
            std::__cxx11::string::~string(local_388);
            in_R9 = pvVar16;
          }
          local_258 = local_258 + 1;
        }
        else {
          if (*pvVar7 != Categorical) {
            local_66a = 1;
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                       (allocator<char> *)in_stack_fffffffffffff780);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                       (allocator<char> *)in_stack_fffffffffffff780);
            std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
            __val = (int)((ulong)local_621 >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff790,(char *)in_stack_fffffffffffff788,
                       (allocator<char> *)in_stack_fffffffffffff780);
            std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
            std::__cxx11::to_string(__val);
            std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
            pbVar13 = local_669;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (pbVar13,(char *)in_stack_fffffffffffff788,
                       (allocator<char> *)in_stack_fffffffffffff780);
            std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
            std::runtime_error::runtime_error(this,local_550);
            local_66a = 0;
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&stack0xffffffffffffffb0->col_num,local_268);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_stack_00000008,*pvVar8);
          std::operator+(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                         (char *)in_stack_fffffffffffff750);
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::string::~string(local_3c8);
          if (*(int *)(in_RDX + 0x1c) == 0) {
            std::__cxx11::string::append((char *)in_RDI);
            local_470 = 0;
            while( true ) {
              uVar1 = local_470;
              pvVar11 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&stack0xffffffffffffffb0->cat_coef,local_260);
              sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
              if (sVar6 <= uVar1) break;
              if (local_470 != 0) {
                std::__cxx11::string::append((char *)in_RDI);
              }
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&stack0xffffffffffffffb0->col_num,local_268);
              pvVar9 = std::
                       vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[](in_stack_00000010,*pvVar8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar9,local_470);
              std::operator+(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                             (char *)in_stack_fffffffffffff750);
              pvVar11 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&stack0xffffffffffffffb0->cat_coef,local_260);
              std::vector<double,_std::allocator<double>_>::operator[](pvVar11,local_470);
              std::__cxx11::to_string
                        ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
              std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
              std::__cxx11::string::append((string *)in_RDI);
              std::__cxx11::string::~string(local_490);
              std::__cxx11::string::~string(local_4f0);
              std::__cxx11::string::~string(local_4b0);
              std::__cxx11::string::~string(local_4d0);
              local_470 = local_470 + 1;
            }
            std::__cxx11::string::append((char *)in_RDI);
          }
          else if (*(int *)(in_RDX + 0x1c) == 0x29) {
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&stack0xffffffffffffffb0->col_num,local_268);
            pvVar9 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](in_stack_00000010,*pvVar8);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&stack0xffffffffffffffb0->chosen_cat,local_260);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvVar9,(long)*pvVar10);
            std::operator+(in_stack_fffffffffffff798,in_stack_fffffffffffff790);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           (char *)in_stack_fffffffffffff750);
            std::vector<double,_std::allocator<double>_>::operator[]
                      (&stack0xffffffffffffffb0->fill_new,local_260);
            std::__cxx11::to_string
                      ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            std::operator+(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           (char *)in_stack_fffffffffffff750);
            std::__cxx11::string::append((string *)in_RDI);
            std::__cxx11::string::~string(local_3e8);
            std::__cxx11::string::~string(local_408);
            std::__cxx11::string::~string(local_468);
            std::__cxx11::string::~string(local_428);
            std::__cxx11::string::~string(local_448);
          }
          if (*(int *)(in_RDX + 0x20) != 0) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      (&stack0xffffffffffffffb0->fill_val,local_268);
            std::__cxx11::to_string
                      ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                           in_stack_fffffffffffff750);
            std::__cxx11::string::append((string *)in_RDI);
            std::__cxx11::string::~string(local_510);
            std::__cxx11::string::~string(local_530);
          }
          local_260 = local_260 + 1;
        }
        std::__cxx11::string::append((char *)in_RDI);
      }
      pbVar13 = &local_6b0;
      __rhs = in_RDI;
      std::__cxx11::to_string((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758))
      ;
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                     in_stack_fffffffffffff750);
      std::__cxx11::string::append((string *)__rhs);
      std::__cxx11::string::~string(local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      if ((*(byte *)(in_RDX + 0x40) & 1) != 0) {
        std::__cxx11::to_string
                  ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        std::operator+((char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                       in_stack_fffffffffffff750);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                       (char *)in_stack_fffffffffffff750);
        std::__cxx11::to_string
                  ((double)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        std::operator+(pbVar13,__rhs);
        std::__cxx11::string::append((string *)in_RDI);
        std::__cxx11::string::~string(local_6d0);
        std::__cxx11::string::~string(local_750);
        std::__cxx11::string::~string(local_6f0);
        std::__cxx11::string::~string(local_710);
        std::__cxx11::string::~string(local_730);
      }
      std::__cxx11::string::append((char *)in_RDI);
      pvVar2 = stack0xffffffffffffffb0;
      bVar15 = SUB81((ulong)stack0xffffffffffffffb0 >> 0x38,0);
      bVar4 = bVar15;
      bVar14 = SUB81((ulong)pvVar2 >> 0x30,0);
      bVar3 = bVar14;
      unique0x10001313 = pvVar2;
      traverse_ext_json(in_RSI,in_RDX,in_RCX,in_R8,(size_t *)in_R9,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(bVar12,CONCAT16(bVar5,in_stack_ffffffffffffffb8)),unaff_retaddr,
                        (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_00000008,bVar4,bVar3,
                        CONCAT71(in_stack_00000021,in_stack_00000020));
      pvVar2 = stack0xffffffffffffffb0;
      bVar15 = SUB81((ulong)stack0xffffffffffffffb0 >> 0x38,0);
      bVar4 = bVar15;
      bVar14 = SUB81((ulong)pvVar2 >> 0x30,0);
      bVar3 = bVar14;
      unique0x1000131b = pvVar2;
      traverse_ext_json(in_RSI,in_RDX,in_RCX,in_R8,(size_t *)in_R9,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(bVar12,CONCAT16(bVar5,in_stack_ffffffffffffffb8)),unaff_retaddr,
                        (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_00000008,bVar4,bVar3,
                        CONCAT71(in_stack_00000021,in_stack_00000020));
    }
  }
  return;
}

Assistant:

void traverse_ext_json
(
    std::string &curr_json, size_t curr_node,
    const ExtIsoForest &model, const std::vector<IsoHPlane> &nodes,
    const size_t *restrict terminal_node_mappings,
    const std::vector<std::string> &numeric_colnames,
    const std::vector<std::string> &categ_colnames,
    const std::vector<std::vector<std::string>> &categ_levels,
    bool output_tree_num, bool index1, size_t tree_num
)
{
    if (interrupt_switch) return;
    const IsoHPlane *hplane = &nodes[curr_node];
    if (curr_node > 0) curr_json.append(",");

    curr_json.append(
        "\"" +
        std::to_string(curr_node + (size_t)index1) +
        "\": {\"terminal\":\""
    );

    /* terminal node */
    if (hplane->hplane_left == 0)
    {
        const double score_write = (model.scoring_metric != Density && model.scoring_metric != BoxedRatio)?
                                    hplane->score : -hplane->score;
        const size_t terminal_idx = terminal_node_mappings[curr_node];
        curr_json.append(
            "yes\", \"score\":" +
            std::to_string(score_write) +
            ", \"leaf\":" +
            std::to_string(terminal_idx) +
            "}"
        );
        return;
    }

    curr_json.append(
        "no\", \"node_when_condition_is_met\":" +
        std::to_string(hplane->hplane_left + (size_t)index1) +
        ", \"node_when_condition_is_not_met\":" +
        std::to_string(hplane->hplane_right + (size_t)index1) +
        ", \"combination\":["
    );

    size_t n_visited_numeric = 0;
    size_t n_visited_categ = 0;
    for (size_t ix = 0; ix < hplane->col_num.size(); ix++)
    {
        if (ix > 0) curr_json.append(", ");
        curr_json.append("{");
        switch (hplane->col_type[ix])
        {
            case Numeric:
            {
                curr_json.append(
                    "\"column\":\"" +
                    numeric_colnames[hplane->col_num[ix]] +
                    "\", \"column_type\":\"numeric\", \"coefficient\":" +
                    std::to_string(hplane->coef[n_visited_numeric]) +
                    ", \"centering\":" +
                    std::to_string(hplane->mean[n_visited_numeric])
                );
                if (model.missing_action != Fail)
                {
                    curr_json.append(
                        ", \"imputation_value\":" +
                        std::to_string(hplane->fill_val[ix])
                    );
                }
                n_visited_numeric++;
                break;
            }

            case Categorical:
            {
                curr_json.append(
                    "\"column\":\"" +
                    categ_colnames[hplane->col_num[ix]] +
                    "\", \"column_type\":\"categorical\", "
                );
                switch (model.cat_split_type)
                {
                    case SingleCateg:
                    {
                        curr_json.append(
                            "\"category\":\"" +
                            categ_levels[hplane->col_num[ix]][hplane->chosen_cat[n_visited_categ]] +
                            "\", \"coefficient_category\":" +
                            std::to_string(hplane->fill_new[n_visited_categ]) +
                            ", \"coefficient_other_categories\":0.0"
                        );
                        break;
                    }

                    case SubSet:
                    {
                        curr_json.append(
                            "\"coefficients\":{"
                        );
                        for (size_t categ = 0; categ < hplane->cat_coef[n_visited_categ].size(); categ++)
                        {
                            if (categ > 0) curr_json.append(", ");
                            curr_json.append(
                                "\"" +
                                categ_levels[hplane->col_num[ix]][categ] +
                                "\":" +
                                std::to_string(hplane->cat_coef[n_visited_categ][categ])
                            );
                        }
                        curr_json.append("}");
                        break;
                    }
                }
                if (model.missing_action != Fail)
                {
                    curr_json.append(
                        ", \"imputation_value\":" +
                        std::to_string(hplane->fill_val[ix])
                    );
                }
                n_visited_categ++;
                break;
            }

            default:
            {
                unexpected_error();
                break;
            }
        }
        curr_json.append("}");
    }

    curr_json.append(
        "], \"condition\":\"<=\", \"value\":" +
        std::to_string(hplane->split_point)
    );

    if (model.has_range_penalty)
    {
        curr_json.append(
            ", \"range_low\":" +
            std::to_string(hplane->range_low) +
            ", \"range_high\":" +
            std::to_string(hplane->range_high)
        );
    }

    curr_json.append("}");

    traverse_ext_json(
        curr_json,
        hplane->hplane_left,
        model, nodes,
        terminal_node_mappings,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, tree_num
    );

    traverse_ext_json(
        curr_json,
        hplane->hplane_right,
        model, nodes,
        terminal_node_mappings,
        numeric_colnames,
        categ_colnames,
        categ_levels,
        output_tree_num, index1, tree_num
    );
}